

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableParameter.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::VariableParameter::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,VariableParameter *this)

{
  ostream *poVar1;
  KINT32 Value;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  VariableParameter *local_18;
  VariableParameter *this_local;
  
  local_18 = this;
  this_local = (VariableParameter *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Variable Parameter:");
  poVar1 = std::operator<<(poVar1,"\n\tType:          ");
  ENUMS::GetEnumAsStringVariableParameterType_abi_cxx11_
            (&local_1d0,(ENUMS *)(ulong)this->m_ui8VarParamType,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString VariableParameter::GetAsString() const
{
    KStringStream ss;

    // For now we return the datum value as a string.
    ss << "Variable Parameter:"
       << "\n\tType:          " << GetEnumAsStringVariableParameterType( m_ui8VarParamType )
       << "\n";

    return ss.str();
}